

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method_property.cpp
# Opt level: O0

void __thiscall
MethodProperty_Index_Test::MethodProperty_Index_Test(MethodProperty_Index_Test *this)

{
  MethodProperty_Index_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MethodProperty_Index_Test_001aca18;
  return;
}

Assistant:

TEST(MethodProperty, Index)
{
  BasicMethodProperties obj;
  
  EXPECT_EQ( 0, obj.getIndex< decltype( obj.ro_int_value ) >() );
  EXPECT_EQ( 1, obj.getIndex< decltype( obj.ro_int_value2 ) >() );
  EXPECT_EQ( 2, obj.getIndex< decltype( obj.ro_string_value ) >() );
  EXPECT_EQ( 3, obj.getIndex< decltype( obj.ro_string_value2 ) >() );
  EXPECT_EQ( 4, obj.getIndex< decltype( obj.int_value ) >() );
  EXPECT_EQ( 5, obj.getIndex< decltype( obj.int_value2 ) >() );
  EXPECT_EQ( 6, obj.getIndex< decltype( obj.int_value3 ) >() );
  EXPECT_EQ( 7, obj.getIndex< decltype( obj.string_value ) >() );
  EXPECT_EQ( 8, obj.getIndex< decltype( obj.string_value2 ) >() );
  EXPECT_EQ( 9, obj.getIndex< decltype( obj.string_value3 ) >() );
}